

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall FIX::double_conversion::Bignum::MultiplyByUInt64(Bignum *this,uint64_t factor)

{
  Vector<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  int index;
  int i;
  int index_00;
  ulong uVar5;
  
  if (factor != 1) {
    if (factor == 0) {
      Zero(this);
      return;
    }
    this_00 = &this->bigits_;
    uVar4 = 0;
    for (index_00 = 0; index = this->used_digits_, index_00 < index; index_00 = index_00 + 1) {
      puVar3 = Vector<unsigned_int>::operator[](this_00,index_00);
      uVar1 = *puVar3;
      puVar3 = Vector<unsigned_int>::operator[](this_00,index_00);
      uVar2 = *puVar3;
      uVar5 = (ulong)((uint)uVar4 & 0xfffffff) + (ulong)uVar1 * (factor & 0xffffffff);
      puVar3 = Vector<unsigned_int>::operator[](this_00,index_00);
      *puVar3 = (uint)uVar5 & 0xfffffff;
      uVar4 = (uVar4 >> 0x1c) + (ulong)uVar2 * (factor >> 0x1c & 0xfffffffffffffff0) +
              (uVar5 >> 0x1c);
    }
    for (; uVar4 != 0; uVar4 = uVar4 >> 0x1c) {
      if (0x7f < index) {
        abort();
      }
      puVar3 = Vector<unsigned_int>::operator[](this_00,index);
      *puVar3 = (uint)uVar4 & 0xfffffff;
      index = this->used_digits_ + 1;
      this->used_digits_ = index;
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt64(uint64_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  ASSERT(kBigitSize < 32);
  uint64_t carry = 0;
  uint64_t low = factor & 0xFFFFFFFF;
  uint64_t high = factor >> 32;
  for (int i = 0; i < used_digits_; ++i) {
    uint64_t product_low = low * bigits_[i];
    uint64_t product_high = high * bigits_[i];
    uint64_t tmp = (carry & kBigitMask) + product_low;
    bigits_[i] = tmp & kBigitMask;
    carry = (carry >> kBigitSize) + (tmp >> kBigitSize) +
        (product_high << (32 - kBigitSize));
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}